

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

void libxml_xmlXPathFuncCallback(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathContextPtr pxVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  PyObject *pPVar7;
  xmlXPathObjectPtr pxVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) ||
     (pxVar1 = ctxt->context, pxVar1 == (xmlXPathContextPtr)0x0)) {
    return;
  }
  pxVar2 = pxVar1->function;
  if (libxml_xpathCallbacksNb < 1) {
    lVar10 = 0;
  }
  else {
    pxVar3 = pxVar1->functionURI;
    lVar9 = 0;
    lVar11 = 0;
    lVar10 = 0;
    do {
      iVar5 = xmlStrEqual(pxVar2,*(undefined8 *)(libxml_xpathCallbacks + lVar9 + 8));
      if ((iVar5 != 0) &&
         (iVar5 = xmlStrEqual(pxVar3,*(undefined8 *)(libxml_xpathCallbacks + lVar9 + 0x10)),
         iVar5 != 0)) {
        lVar10 = *(long *)(libxml_xpathCallbacks + lVar9 + 0x18);
      }
      lVar11 = lVar11 + 1;
      lVar9 = lVar9 + 0x20;
    } while (lVar11 < libxml_xpathCallbacksNb);
  }
  if (lVar10 == 0) {
    printf("libxml_xmlXPathFuncCallback: internal error %s not found !\n",pxVar2);
    return;
  }
  plVar6 = (long *)PyTuple_New((long)(nargs + 1));
  pPVar7 = libxml_xmlXPathParserContextPtrWrap(ctxt);
  PyTuple_SetItem(plVar6,0,pPVar7);
  if (0 < nargs) {
    uVar12 = (ulong)(uint)nargs;
    do {
      pxVar8 = (xmlXPathObjectPtr)valuePop(ctxt);
      pPVar7 = libxml_xmlXPathObjectPtrWrap(pxVar8);
      PyTuple_SetItem(plVar6,uVar12,pPVar7);
      bVar4 = 1 < (long)uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar4);
  }
  pPVar7 = (PyObject *)PyObject_CallObject(lVar10,plVar6);
  *plVar6 = *plVar6 + -1;
  if (*plVar6 == 0) {
    _Py_Dealloc(plVar6);
  }
  pxVar8 = libxml_xmlXPathObjectPtrConvert(pPVar7);
  valuePush(ctxt,pxVar8);
  return;
}

Assistant:

static void
libxml_xmlXPathFuncCallback(xmlXPathParserContextPtr ctxt, int nargs)
{
    PyObject *list, *cur, *result;
    xmlXPathObjectPtr obj;
    xmlXPathContextPtr rctxt;
    PyObject *current_function = NULL;
    const xmlChar *name;
    const xmlChar *ns_uri;
    int i;

    if (ctxt == NULL)
        return;
    rctxt = ctxt->context;
    if (rctxt == NULL)
        return;
    name = rctxt->function;
    ns_uri = rctxt->functionURI;

    /*
     * Find the function, it should be there it was there at lookup
     */
    for (i = 0; i < libxml_xpathCallbacksNb; i++) {
        if (                    /* TODO (ctxt == libxml_xpathCallbacks[i].ctx) && */
						(xmlStrEqual(name, (*libxml_xpathCallbacks)[i].name)) &&
               (xmlStrEqual(ns_uri, (*libxml_xpathCallbacks)[i].ns_uri))) {
					current_function = (*libxml_xpathCallbacks)[i].function;
        }
    }
    if (current_function == NULL) {
        printf
            ("libxml_xmlXPathFuncCallback: internal error %s not found !\n",
             name);
        return;
    }

    list = PyTuple_New(nargs + 1);
    PyTuple_SetItem(list, 0, libxml_xmlXPathParserContextPtrWrap(ctxt));
    for (i = nargs - 1; i >= 0; i--) {
        obj = valuePop(ctxt);
        cur = libxml_xmlXPathObjectPtrWrap(obj);
        PyTuple_SetItem(list, i + 1, cur);
    }
    result = PyObject_CallObject(current_function, list);
    Py_DECREF(list);

    obj = libxml_xmlXPathObjectPtrConvert(result);
    valuePush(ctxt, obj);
}